

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger.h
# Opt level: O1

void __thiscall spdlog::async_logger::~async_logger(async_logger *this)

{
  log_err_handler *plVar1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar3;
  
  std::
  unique_ptr<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
  ::~unique_ptr(&this->_async_log_helper);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__logger_001b0820;
  p_Var2 = (this->super_logger)._err_handler.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    plVar1 = &(this->super_logger)._err_handler;
    (*p_Var2)((_Any_data *)plVar1,(_Any_data *)plVar1,__destroy_functor);
  }
  this_00 = (this->super_logger)._formatter.
            super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&(this->super_logger)._sinks);
  pcVar3 = (this->super_logger)._name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_logger)._name.field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

class async_logger SPDLOG_FINAL : public logger
{
public:
    template<class It>
    async_logger(const std::string &logger_name, const It &begin, const It &end, size_t queue_size,
        const async_overflow_policy overflow_policy = async_overflow_policy::block_retry,
        const std::function<void()> &worker_warmup_cb = nullptr,
        const std::chrono::milliseconds &flush_interval_ms = std::chrono::milliseconds::zero(),
        const std::function<void()> &worker_teardown_cb = nullptr);

    async_logger(const std::string &logger_name, sinks_init_list sinks, size_t queue_size,
        const async_overflow_policy overflow_policy = async_overflow_policy::block_retry,
        const std::function<void()> &worker_warmup_cb = nullptr,
        const std::chrono::milliseconds &flush_interval_ms = std::chrono::milliseconds::zero(),
        const std::function<void()> &worker_teardown_cb = nullptr);

    async_logger(const std::string &logger_name, sink_ptr single_sink, size_t queue_size,
        const async_overflow_policy overflow_policy = async_overflow_policy::block_retry,
        const std::function<void()> &worker_warmup_cb = nullptr,
        const std::chrono::milliseconds &flush_interval_ms = std::chrono::milliseconds::zero(),
        const std::function<void()> &worker_teardown_cb = nullptr);

    // Wait for the queue to be empty, and flush synchronously
    // Warning: this can potentially last forever as we wait it to complete
    void flush() override;

    // Error handler
    void set_error_handler(log_err_handler) override;
    log_err_handler error_handler() override;

protected:
    void _sink_it(details::log_msg &msg) override;
    void _set_formatter(spdlog::formatter_ptr msg_formatter) override;
    void _set_pattern(const std::string &pattern, pattern_time_type pattern_time) override;

private:
    std::unique_ptr<details::async_log_helper> _async_log_helper;
}